

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O2

_Bool av1_compute_corner_list
                (YV12_BUFFER_CONFIG *frame,int bit_depth,int downsample_level,CornerList *corners)

{
  ImagePyramid *pyr;
  PyramidLayer *pPVar1;
  int i;
  int iVar2;
  uint uVar3;
  xy *__ptr;
  long lVar4;
  byte bVar5;
  uint uVar6;
  int i_1;
  long lVar7;
  _Bool _Var8;
  int *scores;
  int num_corners;
  int local_438 [258];
  
  pthread_mutex_lock((pthread_mutex_t *)corners);
  _Var8 = true;
  if (corners->valid == false) {
    pyr = frame->y_pyramid;
    iVar2 = aom_compute_pyramid(frame,bit_depth,downsample_level + 1,pyr);
    if (iVar2 < 0) {
      _Var8 = false;
    }
    else {
      iVar2 = iVar2 + -1;
      pPVar1 = pyr->layers;
      scores = (int *)0x0;
      __ptr = aom_fast9_detect_nonmax
                        (pPVar1[iVar2].buffer,pPVar1[iVar2].width,pPVar1[iVar2].height,
                         pPVar1[iVar2].stride,0x12,&scores,&num_corners);
      lVar7 = (long)num_corners;
      if (-1 < lVar7) {
        bVar5 = (byte)iVar2;
        if ((uint)num_corners < 0x1001) {
          for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 1) {
            corners->corners[lVar4 * 2] = __ptr[lVar4].x << (bVar5 & 0x1f);
            corners->corners[lVar4 * 2 + 1] = __ptr[lVar4].y << (bVar5 & 0x1f);
          }
          corners->num_corners = num_corners;
        }
        else {
          memset(local_438,0,0x400);
          for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 1) {
            local_438[scores[lVar4]] = local_438[scores[lVar4]] + 1;
          }
          uVar6 = 0xff;
          iVar2 = 0;
          while ((uVar3 = 0xffffffff, -1 < (int)uVar6 &&
                 (iVar2 = iVar2 + local_438[uVar6], uVar3 = uVar6, iVar2 < 0x1001))) {
            uVar6 = uVar6 - 1;
          }
          iVar2 = 0;
          for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 1) {
            if ((int)uVar3 < scores[lVar4]) {
              corners->corners[iVar2 * 2] = __ptr[lVar4].x << (bVar5 & 0x1f);
              corners->corners[iVar2 * 2 + 1] = __ptr[lVar4].y << (bVar5 & 0x1f);
              iVar2 = iVar2 + 1;
            }
          }
          corners->num_corners = iVar2;
        }
        free(scores);
        free(__ptr);
      }
      _Var8 = -1 < num_corners;
    }
    corners->valid = _Var8;
  }
  pthread_mutex_unlock((pthread_mutex_t *)corners);
  return _Var8;
}

Assistant:

bool av1_compute_corner_list(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                             int downsample_level, CornerList *corners) {
  assert(corners);

#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD

  if (!corners->valid) {
    corners->valid =
        compute_corner_list(frame, bit_depth, downsample_level, corners);
  }
  bool valid = corners->valid;

#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
  return valid;
}